

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

int __thiscall CDesign::Initialize(CDesign *this,char *pName)

{
  undefined1 *__filename;
  undefined1 *__filename_00;
  Branch *pBVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint iX1;
  uint iY1;
  uint iLayer;
  uint iY2;
  uint uVar7;
  FILE *pFVar8;
  FILE *__stream;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  CLayer *pCVar12;
  CLayer *this_00;
  CNet *pCVar13;
  CPin *pCVar14;
  int *piVar15;
  CWire *pCVar16;
  CPin *pCVar17;
  CBoundary *this_01;
  int iVar18;
  ulong uVar19;
  int k;
  ulong uVar20;
  Branch *pBVar21;
  int j;
  uint uVar22;
  long lVar23;
  long lVar24;
  Branch *pBVar25;
  int iVar26;
  ulong uVar27;
  int iZ;
  int iVar28;
  long lVar29;
  Tree TVar30;
  int local_694;
  CPin *pPin;
  int local_66c;
  vector<CPin_*,_std::allocator<CPin_*>_> PinList;
  char cLine [512];
  char cNetName [512];
  char cName [512];
  
  ReadParam(this,pName);
  if (CObject::m_pLog != (FILE *)0x0) {
    fclose((FILE *)CObject::m_pLog);
    CObject::m_pLog = (FILE *)0x0;
  }
  __filename = &this->field_0x234;
  sprintf(cName,"%s.log",__filename);
  CObject::m_pLog = (FILE *)fopen(cName,"wt");
  CObject::m_pDesign = this;
  CObject::Display(0,"input file [%s]\n",__filename);
  __filename_00 = &this->field_0x434;
  CObject::Display(0,"tree file [%s]\n",__filename_00);
  pFVar8 = fopen(__filename,"rt");
  __stream = fopen(__filename_00,"rt");
  if (__stream == (FILE *)0x0) {
    CObject::Display(0,"tree file will be written as ");
    if (*__filename_00 == '\0') {
      sprintf(__filename_00,"%s.stt",__filename);
    }
    CObject::Display(5,"%s",__filename_00);
    __stream = fopen(__filename_00,"wt");
    readLUT();
    CObject::Display(0,"building steiner tree by *pure flute\n");
  }
  else {
    this->IsLUTup = 1;
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                do {
                  pcVar9 = fgets(cLine,0x200,pFVar8);
                  if (pcVar9 == (char *)0x0) goto LAB_00105eda;
                } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
                pcVar9 = strtok(cLine," \t\n");
                iVar2 = strcasecmp(pcVar9,"grid");
                if (iVar2 != 0) break;
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar2 = atoi(pcVar9);
                this->m_iSizeX = iVar2;
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar2 = atoi(pcVar9);
                this->m_iSizeY = iVar2;
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar2 = 2;
                if ((pcVar9 != (char *)0x0) && (iVar2 = atoi(pcVar9), iVar2 < 3)) {
                  iVar2 = 2;
                }
                this->m_iSizeZ = iVar2;
                CBBox::Initialize(&this->super_CBBox,0,0,0,this->m_iSizeX,this->m_iSizeY,iVar2);
                CreateLayer(this);
              }
              iVar2 = strcasecmp(pcVar9,"vertical");
              if ((iVar2 != 0) || (pcVar11 = strtok((char *)0x0," \t\n"), pcVar11 == (char *)0x0))
              break;
              iVar2 = 1;
              while (pcVar9 = strtok((char *)0x0," \t\n"), pcVar9 != (char *)0x0) {
                iVar3 = atoi(pcVar9);
                if (iVar3 == 0) {
                  iVar2 = iVar2 + 1;
                }
                else {
                  do {
                    iVar26 = iVar2;
                    pCVar12 = GetLayer(this,iVar26);
                    iVar2 = iVar26 + 1;
                  } while ((pCVar12->super_CObject).m_Key != 0);
                  pCVar12 = GetLayer(this,iVar26);
                  CLayer::Configure(pCVar12,iVar26,iVar3,10,0,0,0,this);
                }
              }
            }
            iVar2 = strcasecmp(pcVar9,"horizontal");
            if ((iVar2 != 0) || (pcVar11 = strtok((char *)0x0," \t\n"), pcVar11 == (char *)0x0))
            break;
            iVar2 = 1;
            while (pcVar9 = strtok((char *)0x0," \t\n"), pcVar9 != (char *)0x0) {
              iVar3 = atoi(pcVar9);
              if (iVar3 == 0) {
                iVar2 = iVar2 + 1;
              }
              else {
                do {
                  iVar26 = iVar2;
                  pCVar12 = GetLayer(this,iVar26);
                  iVar2 = iVar26 + 1;
                } while ((pCVar12->super_CObject).m_Key != 0);
                pCVar12 = GetLayer(this,iVar26);
                CLayer::Configure(pCVar12,iVar26,iVar3,5,0,0,0,this);
              }
            }
          }
          iVar2 = strcasecmp(pcVar9,"minimum");
          if (iVar2 != 0) break;
          pcVar9 = strtok((char *)0x0," \t\n");
          iVar2 = strcasecmp(pcVar9,"width");
          if (iVar2 == 0) {
            pcVar9 = strtok((char *)0x0," \t\n");
            iVar2 = 1;
            while (pcVar9 != (char *)0x0) {
              pCVar12 = GetLayer(this,iVar2);
              iVar3 = atoi(pcVar9);
              CLayer::Configure(pCVar12,-1,-1,-1,iVar3,-1,-1,this);
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar2 = iVar2 + 1;
            }
          }
          else {
            iVar2 = strcasecmp(pcVar9,"spacing");
            if (iVar2 == 0) {
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar2 = 1;
              while (pcVar9 != (char *)0x0) {
                pCVar12 = GetLayer(this,iVar2);
                iVar3 = atoi(pcVar9);
                CLayer::Configure(pCVar12,-1,-1,-1,-1,iVar3,-1,this);
                pcVar9 = strtok((char *)0x0," \t\n");
                iVar2 = iVar2 + 1;
              }
            }
          }
        }
        iVar2 = strcasecmp(pcVar9,"via");
        if (iVar2 != 0) break;
        pcVar9 = strtok((char *)0x0," \t\n");
        iVar2 = strcasecmp(pcVar9,"spacing");
        if (iVar2 == 0) {
          pcVar9 = strtok((char *)0x0," \t\n");
          iVar2 = 1;
          while (pcVar9 != (char *)0x0) {
            pCVar12 = GetLayer(this,iVar2);
            iVar3 = atoi(pcVar9);
            CLayer::Configure(pCVar12,-1,-1,-1,-1,-1,iVar3,this);
            pcVar9 = strtok((char *)0x0," \t\n");
            iVar2 = iVar2 + 1;
          }
        }
      }
      iVar2 = strcasecmp(pcVar9,"num");
      if (iVar2 == 0) break;
      iVar2 = atoi(pcVar9);
      this->m_iLowX = iVar2;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar2 = atoi(pcVar9);
      this->m_iLowY = iVar2;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar2 = atoi(pcVar9);
      this->m_iGridX = iVar2;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar2 = atoi(pcVar9);
      this->m_iGridY = iVar2;
    }
    pcVar9 = strtok((char *)0x0," \t\n");
    iVar2 = strcasecmp(pcVar9,"net");
  } while (iVar2 != 0);
  pcVar9 = strtok((char *)0x0," \t\n");
  iVar2 = atoi(pcVar9);
  CreateNet(this,iVar2);
  iVar2 = 0;
  while( true ) {
    iVar26 = iVar2 + 1;
    iVar3 = (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ;
    if (iVar3 < iVar26) break;
    pCVar12 = GetLayer(this,iVar26);
    if ((pCVar12->super_CObject).m_Key == 0) {
      iVar3 = 10;
      if (iVar2 != 0) {
        this_00 = GetLayer(this,iVar2);
        iVar2 = CLayer::GetDirection(this_00);
        iVar3 = (uint)(iVar2 != 10) * 5 + 5;
      }
      CLayer::Configure(pCVar12,iVar26,0,iVar3,0,0,0,this);
    }
    (*(pCVar12->super_CObject)._vptr_CObject[3])(pCVar12);
    iVar2 = this->m_iMaxCapacity;
    iVar3 = CLayer::GetCapacity(pCVar12,0x40);
    if (iVar3 < iVar2) {
      iVar2 = this->m_iMaxCapacity;
    }
    else {
      iVar2 = CLayer::GetCapacity(pCVar12,0x40);
    }
    this->m_iMaxCapacity = iVar2;
    iVar2 = iVar26;
  }
  this->m_iHighestRoutableLayer = iVar3;
  this->m_iLowestRoutableLayer = 1;
LAB_00105eda:
  uVar4 = GetCapacity(this,0x1000);
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
  iVar2 = GetMemory();
  CObject::Display(0,"reading nets started (%.1f MB)\n",(double)iVar2 * 0.0009765625);
  local_694 = 0;
  for (local_66c = 0; local_66c < this->m_iNumNet; local_66c = local_66c + 1) {
    do {
      pcVar9 = fgets(cLine,0x200,pFVar8);
      if (pcVar9 == (char *)0x0) break;
    } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
    pcVar9 = strtok(cLine," \t\n");
    sprintf(cNetName,pcVar9);
    pcVar9 = strtok((char *)0x0," \t\n");
    uVar4 = atoi(pcVar9);
    pcVar9 = strtok((char *)0x0," \t\n");
    iVar2 = atoi(pcVar9);
    strtok((char *)0x0," \t\n");
    pCVar13 = (CNet *)operator_new(0x68);
    CNet::CNet(pCVar13);
    lVar23 = (long)local_694;
    this->m_ppNet[lVar23] = pCVar13;
    pCVar13 = this->m_ppNet[lVar23];
    if (pCVar13 == (CNet *)0x0) {
      __assert_fail("m_ppNet[iNetIndex]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x30c,"virtual int CDesign::Initialize(char *)");
    }
    (*(pCVar13->super_CObject)._vptr_CObject[3])(pCVar13,(ulong)uVar4);
    if (1000 < iVar2) {
      CObject::Display(3,"net (%s) with too many pins (%d) will be ignored\n",cNetName);
      for (iVar3 = 0; iVar3 != iVar2; iVar3 = iVar3 + 1) {
        do {
          pcVar9 = fgets(cLine,0x200,pFVar8);
          if (pcVar9 == (char *)0x0) break;
        } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
      }
      iVar2 = 0;
    }
    PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar3 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
      do {
        pcVar9 = fgets(cLine,0x200,pFVar8);
        if (pcVar9 == (char *)0x0) break;
      } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
      pcVar9 = strtok(cLine," \t\n");
      iVar26 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar5 = atoi(pcVar9);
      uVar19 = (long)(iVar26 - this->m_iLowX) / (long)this->m_iGridX;
      uVar27 = (long)(iVar5 - this->m_iLowY) / (long)this->m_iGridY;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar26 = 1;
      if (pcVar9 != (char *)0x0) {
        iVar26 = atoi(pcVar9);
      }
      pPin = (CPin *)0x0;
      uVar20 = 0;
      pCVar14 = (CPin *)0x0;
      while( true ) {
        if (((ulong)((long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) <= uVar20) ||
           (pCVar14 != (CPin *)0x0)) break;
        pCVar14 = PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20];
        if (((int)uVar19 != (int)(pCVar14->super_CPoint).m_iX) ||
           (pCVar17 = pCVar14, (int)uVar27 != (int)(pCVar14->super_CPoint).m_iY)) {
          pCVar14 = (CPin *)0x0;
          pCVar17 = pPin;
        }
        pPin = pCVar17;
        uVar20 = uVar20 + 1;
      }
      if (pCVar14 == (CPin *)0x0) {
        pCVar14 = (CPin *)operator_new(0x28);
        CPin::CPin(pCVar14);
        pPin = pCVar14;
        (*(pCVar14->super_CPoint).super_CObject._vptr_CObject[4])
                  (pCVar14,(ulong)((long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3,
                   uVar19 & 0xffffffff,uVar27 & 0xffffffff,iVar26,pCVar13);
        std::vector<CPin_*,_std::allocator<CPin_*>_>::push_back(&PinList,&pPin);
      }
    }
    CNet::AddPin(pCVar13,&PinList);
    if (this->IsLUTup == 0) {
      while( true ) {
        pcVar9 = fgets(cLine,0x200,__stream);
        if ((pcVar9 == (char *)0x0) || (cLine[0] == '!')) break;
        if ((cLine[0] != '#') && (sVar10 = strlen(cLine), 1 < sVar10)) {
          strtok(cLine," \t\n");
          iVar3 = 0;
          strtok((char *)0x0," \t\n");
          pcVar9 = strtok((char *)0x0," \t\n");
          iVar2 = atoi(pcVar9);
          if (iVar2 < 1) {
            iVar2 = iVar3;
          }
          for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
            do {
              pcVar9 = fgets(cLine,0x200,__stream);
              if (pcVar9 == (char *)0x0) break;
            } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
            iVar26 = CNet::GetNumPin(pCVar13);
            if (1 < iVar26) {
              pCVar16 = CWire::New();
              if (pCVar16 == (CWire *)0x0) {
                __assert_fail("pWire",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                              ,0x3a7,"virtual int CDesign::Initialize(char *)");
              }
              pcVar9 = strtok(cLine," \t\n");
              iVar26 = atoi(pcVar9);
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar5 = atoi(pcVar9);
              strtok((char *)0x0," \t\n");
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar6 = atoi(pcVar9);
              pcVar9 = strtok((char *)0x0," \t\n");
              iVar18 = atoi(pcVar9);
              pCVar14 = CNet::GetPin(pCVar13,iVar26,iVar5);
              pCVar17 = CNet::GetPin(pCVar13,iVar6,iVar18);
              if (pCVar14 == (CPin *)0x0) {
                iVar28 = this->m_iLowestRoutableLayer;
              }
              else {
                iVar28 = (int)(pCVar14->super_CPoint).m_cZ;
              }
              if (pCVar17 == (CPin *)0x0) {
                iZ = this->m_iLowestRoutableLayer;
              }
              else {
                iZ = (int)(pCVar17->super_CPoint).m_cZ;
              }
              if (iZ < iVar28) {
                if (pCVar14 == (CPin *)0x0) {
                  iZ = this->m_iLowestRoutableLayer;
                }
                else {
                  iZ = (int)(pCVar14->super_CPoint).m_cZ;
                }
              }
              CWire::Initialize(pCVar16,iVar26,iVar5,iVar6,iVar18,iZ);
              CNet::AddWire(pCVar13,pCVar16);
            }
          }
        }
      }
    }
    else {
      iVar2 = CNet::GetNumPin(pCVar13);
      if (iVar2 < 2) {
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"%s %d %d\n!\n",cNetName,(ulong)(uint)(pCVar13->super_CObject).m_Key,0);
        }
      }
      else {
        lVar29 = 0;
        for (lVar24 = 0; iVar2 = CNet::GetNumPin(pCVar13), lVar24 < iVar2; lVar24 = lVar24 + 1) {
          pCVar14 = CNet::GetPin(pCVar13,(int)lVar24);
          *(int *)((long)Initialize::iArrX + lVar29) = (int)(pCVar14->super_CPoint).m_iX;
          pCVar14 = CNet::GetPin(pCVar13,(int)lVar24);
          *(int *)((long)Initialize::iArrY + lVar29) = (int)(pCVar14->super_CPoint).m_iY;
          lVar29 = lVar29 + 4;
        }
        iVar2 = CNet::GetNumPin(pCVar13);
        if (iVar2 < 10) {
          iVar2 = CNet::GetNumPin(pCVar13);
          TVar30 = flute(iVar2,Initialize::iArrX,Initialize::iArrY,3);
        }
        else {
          iVar2 = CNet::GetNumPin(pCVar13);
          TVar30 = flute(iVar2,Initialize::iArrX,Initialize::iArrY,0x1c);
        }
        pBVar21 = TVar30.branch;
        iVar2 = TVar30.deg * 2;
        if (iVar2 < 3) {
          iVar2 = 2;
        }
        piVar15 = &pBVar21->n;
        uVar27 = 0;
        for (uVar19 = 0; iVar2 - 2 != uVar19; uVar19 = uVar19 + 1) {
          uVar4 = *piVar15;
          if ((uVar19 != uVar4) &&
             ((((Branch *)(piVar15 + -2))->x != pBVar21[(int)uVar4].x ||
              (piVar15[-1] != pBVar21[(int)uVar4].y)))) {
            uVar27 = (ulong)((int)uVar27 + 1);
          }
          piVar15 = piVar15 + 3;
        }
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"%s %d %d\n",cNetName,(ulong)(uint)(pCVar13->super_CObject).m_Key,uVar27)
          ;
        }
        pBVar25 = pBVar21;
        for (uVar19 = 0; iVar2 - 2 != uVar19; uVar19 = uVar19 + 1) {
          uVar4 = pBVar25->n;
          if (uVar19 != uVar4) {
            pBVar1 = pBVar21 + (int)uVar4;
            if ((pBVar25->x != pBVar21[(int)uVar4].x) || (pBVar25->y != pBVar1->y)) {
              if (__stream != (FILE *)0x0) {
                fprintf(__stream,"%d %d - %d %d\n",(ulong)(uint)pBVar25->x,(ulong)(uint)pBVar25->y,
                        (ulong)(uint)pBVar21[(int)uVar4].x,(ulong)(uint)pBVar1->y);
              }
              pCVar16 = CWire::New();
              if (pCVar16 == (CWire *)0x0) {
                __assert_fail("pWire",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                              ,0x37b,"virtual int CDesign::Initialize(char *)");
              }
              iVar3 = pBVar25->x;
              iVar26 = pBVar25->y;
              iVar5 = pBVar1->x;
              iVar6 = pBVar1->y;
              pCVar14 = CNet::GetPin(pCVar13,iVar3,iVar26);
              pCVar17 = CNet::GetPin(pCVar13,iVar5,iVar6);
              if (pCVar14 == (CPin *)0x0) {
                iVar18 = this->m_iLowestRoutableLayer;
              }
              else {
                iVar18 = (int)(pCVar14->super_CPoint).m_cZ;
              }
              if (pCVar17 == (CPin *)0x0) {
                iVar28 = this->m_iLowestRoutableLayer;
              }
              else {
                iVar28 = (int)(pCVar17->super_CPoint).m_cZ;
              }
              if (iVar28 < iVar18) {
                if (pCVar14 == (CPin *)0x0) {
                  iVar28 = this->m_iLowestRoutableLayer;
                }
                else {
                  iVar28 = (int)(pCVar14->super_CPoint).m_cZ;
                }
              }
              CWire::Initialize(pCVar16,iVar3,iVar26,iVar5,iVar6,iVar28);
              CNet::AddWire(pCVar13,pCVar16);
            }
          }
          pBVar25 = pBVar25 + 1;
        }
        if (__stream != (FILE *)0x0) {
          fwrite("!\n",2,1,__stream);
        }
        fflush(__stream);
      }
    }
    iVar2 = CNet::IsLocal(pCVar13);
    if (iVar2 == 0) {
      iVar2 = CNet::GetNumWire(pCVar13,1,3);
      if (iVar2 == 0) {
        CObject::Display(1,"net %s should have at least one wire\n",cNetName);
      }
      iVar2 = CNet::GetLength(pCVar13,1,2);
      pCVar13->m_iMinWL = iVar2;
      local_694 = local_694 + 1;
    }
    else {
      if (pCVar13 != this->m_ppNet[lVar23]) {
        __assert_fail("pNet==m_ppNet[iNetIndex]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3bd,"virtual int CDesign::Initialize(char *)");
      }
      (*(this->m_ppNet[lVar23]->super_CObject)._vptr_CObject[1])();
      this->m_ppNet[lVar23] = (CNet *)0x0;
      this->m_iNumLocalNet = this->m_iNumLocalNet + 1;
    }
    std::_Vector_base<CPin_*,_std::allocator<CPin_*>_>::~_Vector_base
              (&PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>);
  }
  CreateNet(this,local_694);
  do {
    pcVar9 = fgets(cLine,0x200,pFVar8);
    if (pcVar9 == (char *)0x0) goto LAB_00106a1d;
  } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
  uVar4 = atoi(cLine);
  if (uVar4 != 0) {
    uVar22 = 0;
    CObject::Display(0,"%d blocakges are specified\n",(ulong)uVar4);
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    for (; uVar22 != uVar4; uVar22 = uVar22 + 1) {
      do {
        pcVar9 = fgets(cLine,0x200,pFVar8);
        if (pcVar9 == (char *)0x0) break;
      } while ((cLine[0] == '#') || (sVar10 = strlen(cLine), sVar10 < 2));
      pcVar9 = strtok(cLine," \t\n");
      iX1 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iY1 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iLayer = atoi(pcVar9);
      uVar19 = (ulong)iLayer;
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar2 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      iY2 = atoi(pcVar9);
      pcVar9 = strtok((char *)0x0," \t\n");
      uVar7 = atoi(pcVar9);
      if (iLayer != uVar7) {
        __assert_fail("iZ1==iZ2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f0,"virtual int CDesign::Initialize(char *)");
      }
      if (iY1 - iY2 != 0 && iX1 - iVar2 != 0) {
        __assert_fail("iX1==iX2||iY1==iY2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f1,"virtual int CDesign::Initialize(char *)");
      }
      if ((((iX1 - iVar2) + 1 & 0xfffffffd) != 0) && (((iY1 - iY2) + 1 & 0xfffffffd) != 0)) {
        __assert_fail("abs((iX1-iX2))==1||abs((iY1-iY2))==1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x3f2,"virtual int CDesign::Initialize(char *)");
      }
      pCVar12 = GetLayer(this,iLayer);
      this_01 = CLayer::GetBoundary(pCVar12,iX1,iY1,iVar2,iY2);
      if (this_01 == (CBoundary *)0x0) {
        CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",(ulong)iX1,(ulong)iY1,uVar19
                         ,iVar2,(ulong)iY2,uVar19);
      }
      if (*(short *)&(this_01->super_CPoint).field_0x26 != 0) {
        CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",(ulong)iX1,(ulong)iY1,
                         uVar19,iVar2,(ulong)iY2,uVar19);
      }
      pCVar12 = CBoundary::GetParent(this_01);
      iVar2 = CLayer::GetCapacity(pCVar12,0x40);
      pcVar9 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar9);
      this->m_iNumBCap = this->m_iNumBCap + (iVar2 - iVar3);
      CBoundary::AdjustCapacity(this_01,iVar2 - iVar3);
    }
    uVar4 = GetCapacity(this,0x1000);
    CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
  }
LAB_00106a1d:
  if (pFVar8 != (FILE *)0x0) {
    fclose(pFVar8);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  uVar4 = GetNumNet(this,1,3);
  iVar2 = GetMemory();
  CObject::Display(0,"input [%s with %d nets] is loaded (%.1f MB)\n",(double)iVar2 * 0.0009765625,
                   __filename,(ulong)uVar4);
  if ((this->field_0x834 != '\0') &&
     (pFVar8 = fopen(&this->field_0x834,"rt"), pFVar8 != (FILE *)0x0)) {
    fclose(pFVar8);
    this->field_0xc50 = this->field_0xc50 & 0xfc;
  }
  if (*(int *)&this->field_0xc54 < 0) {
    iVar3 = (int)(this->super_CBBox).m_iMaxX - (int)(this->super_CBBox).m_iMinX;
    iVar2 = (int)(this->super_CBBox).m_iMaxY - (int)(this->super_CBBox).m_iMinY;
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    *(int *)&this->field_0xc54 = (int)((double)iVar2 * 0.1);
  }
  CObject::Display(2,"mazerouting margin %d\n");
  (*(this->super_CObject)._vptr_CObject[2])(this,stdout,0);
  return 1;
}

Assistant:

int	CDesign::Initialize(char* pName)
{
#ifdef _DEBUG
	m_iDebugNet	=	188;
#endif
	ReadParam(pName);

	//SetState(STATE_DESN_COMPLETED);
	//PrintResult();

	//vector<CGrid*>	Queue;

	//CGrid	G[4];
	//CGrid* pG[4];

	//G[0].SetMazeCostGrid(1,NULL);
	//G[1].SetMazeCostGrid(7,NULL);
	//G[2].SetMazeCostGrid(4,NULL);
	//G[3].SetMazeCostGrid(3,NULL);

	//Queue.push_back(&G[0]);

	//make_heap(Queue.begin(),Queue.end(),CGridOpMaze());

	//Queue.push_back(&G[1]);
	//Queue.push_back(&G[2]);
	//Queue.push_back(&G[3]);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());

	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	//G[1].SetMazeCostGrid(2,NULL);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());


	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	char	cName[MAX_BUFFER_STR];
	char	cLine[MAX_BUFFER_STR];

	//open log fiile
	SAFE_FCLOSE(m_pLog);
	sprintf(cName,"%s.log",m_Param.m_cInput_File);	
	m_pLog		=	fopen(cName,"wt");
	m_pDesign	=	this;

	Display(DISPLAY_MODE_INFO,"input file [%s]\n",m_Param.m_cInput_File);
	Display(DISPLAY_MODE_INFO,"tree file [%s]\n",m_Param.m_cTree_File);

	FILE*	pInput_File		=	fopen(m_Param.m_cInput_File,"rt");
	FILE*	pTree_File		=	fopen(m_Param.m_cTree_File,"rt");

	if(pTree_File==NULL)
	{
		Display(DISPLAY_MODE_INFO,"tree file will be written as ");

#ifdef WIN32

		// open in write mode [1/31/2007 thyeros]
		pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
		readLUT();
#else
		
		char	cCmd[MAX_BUFFER_STR];

		//if(STRICMP(m_Param.m_cTree_File,"flute")==0 )
		//{
			// open in write mode [1/31/2007 thyeros]
		  	if(strlen(m_Param.m_cTree_File)==0)
			  {
			    sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			  }

			Display(DISPLAY_MODE_NONE,"%s",m_Param.m_cTree_File);


			pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
			readLUT(); // Before use flute you must init it. Need LUT Data files(provided by flute).

			Display(DISPLAY_MODE_INFO,"building steiner tree by *pure flute\n");
			//}

		/*
		else
		{

			if(strlen(m_Param.m_cTree_File)==0)
			{
				sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			}

			Display(DISPLAY_MODE_NONE,"%s\n",m_Param.m_cTree_File);

			sprintf(cCmd,"./cflute.x -bt %s %s 1.0 > /tmp/stt",m_Param.m_cInput_File,m_Param.m_cTree_File);
			Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
			Display(DISPLAY_MODE_INFO,"building steiner tree in %s...",m_Param.m_cTree_File);
			Display(DISPLAY_MODE_NONE,"done (%d)!\n",system(cCmd));

			pTree_File		=	fopen(m_Param.m_cTree_File,"rt");
		}
		*/
#endif

	}else{
		IsLUTup=1;
	}

    // Read basic param of input data.
	while (fgets(cLine,sizeof(cLine),pInput_File))
	{
		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		char*	pToken	=	strtok(cLine," \t\n");

		if(STRICMP(pToken,"grid")==0)
		{
			m_iSizeX		=	atoi(strtok(NULL," \t\n"));
			m_iSizeY		=	atoi(strtok(NULL," \t\n"));

			pToken			=	strtok(NULL," \t\n");
			if(pToken)	m_iSizeZ	=	max(2,atoi(pToken));		// multilayer routing [1/31/2007 thyeros]
			else		m_iSizeZ	=	2;							// planar routing [1/31/2007 thyeros]

            ///@sa CBBox::Initialize()
			CBBox::Initialize(0,0,0,m_iSizeX,m_iSizeY,m_iSizeZ);

            ///@sa CreateLayer()
			CreateLayer();
		}
		else if(STRICMP(pToken,"vertical")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);	
                    ///@sa CLayer::Configure()
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_VERTICAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"horizontal")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_HORIZONTAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"minimum")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"width")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,atoi(pToken),-1,-1,this);
				}

			}
			else if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,atoi(pToken),-1,this);
				}
			}
		}
		else if(STRICMP(pToken,"via")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,-1,atoi(pToken),this);
				}
			}
		}
		else if(STRICMP(pToken,"num")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"net")==0)
			{
                ///@sa CreatNet()
				CreateNet(atoi(strtok(NULL," \t\n")));

				for (int i=LAYER_METAL1;i<=T();++i)	
				{
					CLayer*	pLayer	=	GetLayer(i);

					if(!pLayer->GetKey())
					{
						int	iDirection	=	-1;

						if(i==LAYER_METAL1)										iDirection	=	DIR_VERTICAL;
						else if(GetLayer(i-1)->GetDirection()==DIR_VERTICAL)	iDirection	=	DIR_HORIZONTAL;
						else													iDirection	=	DIR_VERTICAL;

						pLayer->Configure(i,0,iDirection,0,0,0,this);
					}

                    ///@sa CLayer::Initialize()
					pLayer->Initialize();
					m_iMaxCapacity		=	MAX(m_iMaxCapacity,pLayer->GetCapacity(GET_MODE_MAX));
				}

				///@sa SetHighestRoutableLayer()
				SetHighestRoutableLayer(T());
				///@sa SetLowestRoutableLayer()
				SetLowestRoutableLayer(LAYER_METAL1);

				break;
			}
		}
		else
		{
			m_iLowX		=	atoi(pToken);
			m_iLowY		=	atoi(strtok(NULL," \t\n"));
			m_iGridX	=	atoi(strtok(NULL," \t\n"));
			m_iGridY	=	atoi(strtok(NULL," \t\n"));
		}
	}

	Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
	Display(DISPLAY_MODE_INFO,"reading nets started (%.1f MB)\n",GetMemory()/1024.0);

	//////////////////////////////////////////////////////////////////////////
	// start read nets [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	int	iNetIndex	=	0;
	for(int i=0;i<m_iNumNet;++i)
	{
		while(fgets(cLine,sizeof(cLine),pInput_File))
		{
			if(cLine[0]=='#')	continue;
			if(strlen(cLine)<2)	continue;
			break;
		}

		char	cNetName[MAX_BUFFER_STR];
		sprintf(cNetName,strtok(cLine," \t\n"));
		int		iNetID	 		=	atoi(strtok(NULL," \t\n"));
		int		iNumPin			=	atoi(strtok(NULL," \t\n"));
		int		iWidth			=	1;

		char*	pToken			=	strtok(NULL," \t\n");
		if(pToken)	iWidth		=	atoi(pToken);	

		m_ppNet[iNetIndex]		=	new	CNet;
		assert(m_ppNet[iNetIndex]);

		CNet*	pNet			=	GetNet(iNetIndex);
        ///@sa CNet
		pNet->Initialize(iNetID,/*iWidth,*/this);

		if(iNumPin>1000)
		{
			Display(DISPLAY_MODE_WARN,"net (%s) with too many pins (%d) will be ignored\n",cNetName,iNumPin);

			for(int j=0;j<iNumPin;++j)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}
			}

			iNumPin	=	0;
		}

		// get pins [1/31/2007 thyeros]
		vector<CPin*>	PinList;
		for(int j=0;j<iNumPin;++j)
		{
			while(fgets(cLine,sizeof(cLine),pInput_File))
			{
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;
				break;
			}

			// this is the real location [1/31/2007 thyeros]
			int	iRX				=	atoi(strtok(cLine," \t\n"));
			int	iRY				=	atoi(strtok(NULL," \t\n"));
			int	iX				=	(iRX-m_iLowX)/m_iGridX;
			int	iY				=	(iRY-m_iLowY)/m_iGridY;
			int	iZ				=	LAYER_METAL1;

			pToken				=	strtok(NULL," \t\n");
			if(pToken)	iZ		=	atoi(pToken);

			CPin*		pPin	=	NULL;

			for(int k=0;k<PinList.size()&&!pPin;k++)
			{
				CPin*	pCurPin	=	PinList[k];

				if(pCurPin->X()==iX&&pCurPin->Y()==iY)	pPin		=	pCurPin;
			}

			if(pPin==NULL)
			{
				pPin	=	new	CPin;
				pPin->Initialize(PinList.size(),iX,iY,iZ,pNet);
				PinList.push_back(pPin);
			}
		}

		pNet->AddPin(&PinList);
//		pNet->m_iMinVia	+=	PinList.size();

		if(IsLUTup)
		{
			if(pNet->GetNumPin()<2)
			{
				if(pTree_File) fprintf(pTree_File,"%s %d %d\n!\n",cNetName,(int)pNet->GetKey(),0);
			}
			else
			{
				// create and save a tree topolgy [1/31/2007 thyeros]
				static int iArrX[MAX_BUFFER];
				static int iArrY[MAX_BUFFER];

				for(int j=0;j<pNet->GetNumPin();++j)
				{
					iArrX[j]	=	pNet->GetPin(j)->X();
					iArrY[j]	=	pNet->GetPin(j)->Y();
				}			

				Tree FluteTree;

				if(pNet->GetNumPin()<=9)	FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY);
				else						FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY+25);

				int	iNumWire	=	0;
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					++iNumWire;
				}  

				if(pTree_File) fprintf(pTree_File,"%s %d %d\n",cNetName,(int)pNet->GetKey(),iNumWire);
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					if(pTree_File) fprintf(pTree_File,"%d %d - %d %d\n",  FluteTree.branch[j].x,FluteTree.branch[j].y,FluteTree.branch[iNeighbor].x,FluteTree.branch[iNeighbor].y);

					CWire*	pWire	=	CWire::New();//new	CWire;


					assert(pWire);

					int	iX1			=	FluteTree.branch[j].x;
					int	iY1			=	FluteTree.branch[j].y;
					int	iX2			=	FluteTree.branch[iNeighbor].x;
					int	iY2			=	FluteTree.branch[iNeighbor].y;

					CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
					CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
					int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

					pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
					pNet->AddWire(pWire);
//					pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
				}
				if(pTree_File) fprintf(pTree_File,"!\n");fflush(pTree_File);
			}
		}
		else
		{
			// read the tree toplogy [1/31/2007 thyeros]
			while(fgets(cLine,sizeof(cLine),pTree_File))
			{
				if(cLine[0]=='!')	break;
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;

				char*	pName			=	strtok(cLine," \t\n");
				int		iNetIndex 		=	atoi(strtok(NULL," \t\n"));
				int		iNumWire		=	atoi(strtok(NULL," \t\n"));

				for(int j=0;j<iNumWire;++j)
				{
					while(fgets(cLine,sizeof(cLine),pTree_File))
					{
						if(cLine[0]=='#')	continue;
						if(strlen(cLine)<2)	continue;
						break;
					}

					// larget nets with over 1000pins have ZERO pins [2/20/2007 thyeros]
					if(pNet->GetNumPin()>=2)
					{
						CWire*	pWire	=	CWire::New();//new	CWire;
						assert(pWire);

						int	iX1			=	atoi(strtok(cLine," \t\n"));
						int	iY1			=	atoi(strtok(NULL," \t\n"));
						strtok(NULL," \t\n");	//thyeros- dash.. [6/16/2006]
						int	iX2			=	atoi(strtok(NULL," \t\n"));
						int	iY2			=	atoi(strtok(NULL," \t\n"));

						CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
						CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
						int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

						pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
						pNet->AddWire(pWire);
//						pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
					}
				}				
			}
		}

		if(pNet->IsLocal())
		{
			assert(pNet==m_ppNet[iNetIndex]);

			SAFE_DEL(m_ppNet[iNetIndex]);
			++m_iNumLocalNet;
		}
		else
		{
			if(pNet->GetNumWire()==0)	Display(DISPLAY_MODE_ERRO,"net %s should have at least one wire\n",cNetName);
			pNet->m_iMinWL	=	pNet->GetLength(GET_MODE_STATE,STATE_WIRE_UNROUTED);
			++iNetIndex;
		}
	}

	// save some memory by removing local nets [2/13/2007 thyeros]
	CreateNet(iNetIndex);

	//////////////////////////////////////////////////////////////////////////
	// read speical net/blockages [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	while(fgets(cLine,sizeof(cLine),pInput_File))
	{
		//// temporarily ignore blocakges  [2/27/2007 thyeros]
		//Display(DISPLAY_MODE_WARN,"blockages are ignored for test purpose!\n");
		//break;

		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		int	iNumBlock	=	atoi(cLine);

		if(iNumBlock)
		{
			Display(DISPLAY_MODE_INFO,"%d blocakges are specified\n",iNumBlock);

			for(int i=0;i<iNumBlock;++i)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}

				int	iX1		=	atoi(strtok(cLine," \t\n"));
				int	iY1		=	atoi(strtok(NULL," \t\n"));
				int	iZ1		=	atoi(strtok(NULL," \t\n"));

				int	iX2		=	atoi(strtok(NULL," \t\n"));
				int	iY2		=	atoi(strtok(NULL," \t\n"));
				int	iZ2		=	atoi(strtok(NULL," \t\n"));

				assert(iZ1==iZ2);
				assert(iX1==iX2||iY1==iY2);
				assert(abs((iX1-iX2))==1||abs((iY1-iY2))==1);

				CBoundary*	pBoundary	=	GetLayer(iZ1)->GetBoundary(iX1,iY1,iX2,iY2);

				if(!pBoundary)				Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",iX1,iY1,iZ1,iX2,iY2,iZ2);
				if(pBoundary->m_iNumOCap)	Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",iX1,iY1,iZ1,iX2,iY2,iZ2);

				int	iBlockage	=	pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)-atoi(strtok(NULL," \t\n"));
				m_iNumBCap	+=		iBlockage;
				pBoundary->AdjustCapacity(iBlockage);
			}
			Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
		}

		break;
	}

	SAFE_FCLOSE(pInput_File);
	SAFE_FCLOSE(pTree_File);

	Display(DISPLAY_MODE_INFO,"input [%s with %d nets] is loaded (%.1f MB)\n",m_Param.m_cInput_File,GetNumNet(),GetMemory()/1024.0);

	if(strlen(m_Param.m_cDump_File))
	{
		FILE*	pDumpFile	=	fopen(m_Param.m_cDump_File,"rt");
		if(pDumpFile)
		{
			SAFE_FCLOSE(pDumpFile);
			m_Param.m_iProperty	&=	~(PROP_PARAM_PRER|PROP_PARAM_BOXR);
		}
	}

	if(m_Param.m_iMazeRouting_Margin<0)	m_Param.m_iMazeRouting_Margin	=	0.1*MAX(W(),H());
	Display(DISPLAY_MODE_PARM,"mazerouting margin %d\n",m_Param.m_iMazeRouting_Margin);

	Print(stdout,PRINT_MODE_TEXT);

	return	TRUE;
}